

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

void __thiscall tf::TaskQueue<tf::Node_*>::push(TaskQueue<tf::Node_*> *this,Node *o)

{
  atomic<long> *paVar1;
  int64_t iVar2;
  Array *local_90;
  Array *tmp;
  Array *a;
  int64_t t;
  int64_t b;
  Node *o_local;
  TaskQueue<tf::Node_*> *this_local;
  memory_order local_58;
  int local_54;
  memory_order __b_1;
  __int_type_conflict3 local_48;
  memory_order local_40;
  int local_3c;
  memory_order __b;
  int local_24;
  memory_order __b_2;
  atomic<long> *local_18;
  undefined4 local_c;
  
  paVar1 = &this->_bottom;
  local_3c = 0;
  b = (int64_t)o;
  o_local = (Node *)this;
  ___b = paVar1;
  local_40 = std::operator&(relaxed,__memory_order_mask);
  if (local_3c - 1U < 2) {
    local_48 = (paVar1->super___atomic_base<long>)._M_i;
  }
  else if (local_3c == 5) {
    local_48 = (paVar1->super___atomic_base<long>)._M_i;
  }
  else {
    local_48 = (paVar1->super___atomic_base<long>)._M_i;
  }
  t = local_48;
  local_54 = 2;
  ___b_1 = this;
  local_58 = std::operator&(acquire,__memory_order_mask);
  if (local_54 - 1U < 2) {
    this_local = (TaskQueue<tf::Node_*> *)(this->_top).super___atomic_base<long>._M_i;
  }
  else if (local_54 == 5) {
    this_local = (TaskQueue<tf::Node_*> *)(this->_top).super___atomic_base<long>._M_i;
  }
  else {
    this_local = (TaskQueue<tf::Node_*> *)(this->_top).super___atomic_base<long>._M_i;
  }
  a = (Array *)this_local;
  tmp = std::atomic<tf::TaskQueue<tf::Node_*>::Array_*>::load(&this->_array,relaxed);
  iVar2 = Array::capacity(tmp);
  if (iVar2 + -1 < t - (long)a) {
    local_90 = Array::resize(tmp,t,(int64_t)a);
    std::
    vector<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
    ::push_back(&this->_garbage,&tmp);
    std::swap<tf::TaskQueue<tf::Node*>::Array*>(&tmp,&local_90);
    std::atomic<tf::TaskQueue<tf::Node_*>::Array_*>::store(&this->_array,tmp,release);
  }
  Array::push(tmp,t,(Node *)b);
  local_c = 3;
  paVar1 = &this->_bottom;
  ___b_2 = t + 1;
  local_24 = 0;
  local_18 = paVar1;
  std::operator&(relaxed,__memory_order_mask);
  if (local_24 == 3) {
    (paVar1->super___atomic_base<long>)._M_i = ___b_2;
  }
  else if (local_24 == 5) {
    LOCK();
    (paVar1->super___atomic_base<long>)._M_i = ___b_2;
    UNLOCK();
  }
  else {
    (paVar1->super___atomic_base<long>)._M_i = ___b_2;
  }
  return;
}

Assistant:

void TaskQueue<T>::push(T o) {
  //if(auto tmp = _cache.load(std::memory_order_relaxed); tmp) {
  //  uncached_push(tmp);
  //}
  //_cache.store(o, std::memory_order_relaxed);

  int64_t b = _bottom.load(std::memory_order_relaxed);
  int64_t t = _top.load(std::memory_order_acquire);
  Array* a = _array.load(std::memory_order_relaxed);

  // queue is full
  if(a->capacity() - 1 < (b - t)) {
    Array* tmp = a->resize(b, t);
    _garbage.push_back(a);
    std::swap(a, tmp);
    _array.store(a, std::memory_order_release);
    // Note: the original paper using relaxed causes t-san to complain
    //_array.store(a, std::memory_order_relaxed);
  }

  a->push(b, o);
  std::atomic_thread_fence(std::memory_order_release);
  _bottom.store(b + 1, std::memory_order_relaxed);
}